

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrenum.cpp
# Opt level: O2

char * __thiscall
icu_63::StringEnumeration::next(StringEnumeration *this,int32_t *resultLength,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  
  iVar2 = (*(this->super_UObject)._vptr_UObject[7])(this,status);
  pcVar3 = (char *)0x0;
  if (((UnicodeString *)CONCAT44(extraout_var,iVar2) != (UnicodeString *)0x0) &&
     (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    UnicodeString::operator=(&this->unistr,(UnicodeString *)CONCAT44(extraout_var,iVar2));
    sVar1 = (this->unistr).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar2 = (this->unistr).fUnion.fFields.fLength;
    }
    else {
      iVar2 = (int)sVar1 >> 5;
    }
    ensureCharsCapacity(this,iVar2 + 1,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (resultLength != (int32_t *)0x0) {
        sVar1 = (this->unistr).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar2 = (this->unistr).fUnion.fFields.fLength;
        }
        else {
          iVar2 = (int)sVar1 >> 5;
        }
        *resultLength = iVar2;
      }
      UnicodeString::extract(&this->unistr,0,0x7fffffff,this->chars,this->charsCapacity,kInvariant);
      pcVar3 = this->chars;
    }
    else {
      pcVar3 = (char *)0x0;
    }
  }
  return pcVar3;
}

Assistant:

const char *
StringEnumeration::next(int32_t *resultLength, UErrorCode &status) {
    const UnicodeString *s=snext(status);
    if(U_SUCCESS(status) && s!=NULL) {
        unistr=*s;
        ensureCharsCapacity(unistr.length()+1, status);
        if(U_SUCCESS(status)) {
            if(resultLength!=NULL) {
                *resultLength=unistr.length();
            }
            unistr.extract(0, INT32_MAX, chars, charsCapacity, US_INV);
            return chars;
        }
    }

    return NULL;
}